

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDFObjectHandle::getArrayAsVector
          (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__return_storage_ptr__,
          QPDFObjectHandle *this)

{
  Array array;
  allocator<char> local_39;
  string local_38;
  
  as_array((Array *)&local_38,this,strict);
  if (local_38._M_dataplus._M_p == (pointer)0x0) {
    ::qpdf::Array::~Array((Array *)&local_38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"treating as empty",&local_39);
    typeWarning(this,"array",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    ::qpdf::Array::getAsVector(__return_storage_ptr__,(Array *)&local_38);
    ::qpdf::Array::~Array((Array *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
QPDFObjectHandle::getArrayAsVector() const
{
    if (auto array = as_array(strict)) {
        return array.getAsVector();
    }
    typeWarning("array", "treating as empty");
    QTC::TC("qpdf", "QPDFObjectHandle array treating as empty vector");
    return {};
}